

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Token __thiscall slang::parsing::Preprocessor::nextProcessed(Preprocessor *this)

{
  SyntaxKind SVar1;
  Token *in_RDI;
  Token TVar2;
  Token token;
  Preprocessor *in_stack_00000190;
  Preprocessor *in_stack_00000960;
  Token in_stack_00000968;
  TokenKind local_28;
  
  TVar2 = nextRaw(in_stack_00000190);
  if (((ulong)in_RDI[0x1f].info & 1) != 0) {
    return TVar2;
  }
  local_28 = TVar2.kind;
  if (local_28 != Unknown) {
    if (local_28 == Directive) {
      if (((ulong)in_RDI[0x1f].info & 0x100) != 0) {
        SVar1 = Token::directiveKind(in_RDI);
        if (SVar1 == ElsIfDirective) {
          return TVar2;
        }
        if (SVar1 == ElseDirective) {
          return TVar2;
        }
        if (SVar1 == EndIfDirective) {
          return TVar2;
        }
        if (SVar1 == IfDefDirective) {
          return TVar2;
        }
        if (SVar1 == IfNDefDirective) {
          return TVar2;
        }
      }
      TVar2 = handleDirectives(in_stack_00000960,in_stack_00000968);
      return TVar2;
    }
    if ((3 < (ushort)(local_28 - MacroQuote)) && (local_28 != LineContinuation)) {
      return TVar2;
    }
  }
  TVar2 = handleDirectives(in_stack_00000960,in_stack_00000968);
  return TVar2;
}

Assistant:

Token Preprocessor::nextProcessed() {
    // The core preprocessing routine; this method pulls raw tokens from various text
    // files and converts them into a unified logical stream of sanitized tokens that
    // future stages like a parser can ingest without difficulty.
    //
    // Start off by grabbing the next raw token, either from the current file, an
    // active include file, or an expanded macro.
    auto token = nextRaw();

    // If we're currently within a macro body, return whatever we got right away.
    // If it was a directive it will be deferred until the macro is used.
    if (inMacroBody)
        return token;

    switch (token.kind) {
        // If we found a directive token, process it and pull another. We don't want
        // to return directives to the caller; we handle them ourselves and turn them
        // into trivia.
        case TokenKind::MacroQuote:
        case TokenKind::MacroTripleQuote:
        case TokenKind::MacroEscapedQuote:
        case TokenKind::MacroPaste:
        case TokenKind::LineContinuation:
        case TokenKind::Unknown:
            return handleDirectives(token);
        case TokenKind::Directive:
            if (inIfDefCondition) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        return token;
                    default:
                        break;
                }
            }
            return handleDirectives(token);
        default:
            return token;
    }
}